

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

int Gia_ManLutLevel(Gia_Man_t *p,int **ppLevels)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *__ptr;
  int *piVar4;
  Gia_Obj_t *pObj;
  int iVar5;
  long lVar6;
  long lVar7;
  
  iVar1 = p->nObjs;
  __ptr = (int *)calloc((long)iVar1,4);
  for (lVar6 = 1; iVar5 = (int)lVar6, lVar6 < iVar1; lVar6 = lVar6 + 1) {
    iVar1 = Gia_ObjIsLut(p,iVar5);
    if (iVar1 != 0) {
      lVar7 = 0;
      iVar1 = 0;
      while( true ) {
        iVar2 = Gia_ObjLutSize(p,iVar5);
        if (iVar2 <= lVar7) break;
        piVar4 = Gia_ObjLutFanins(p,iVar5);
        if (iVar1 <= __ptr[piVar4[lVar7]]) {
          iVar1 = __ptr[piVar4[lVar7]];
        }
        lVar7 = lVar7 + 1;
      }
      __ptr[lVar6] = iVar1 + 1;
    }
    iVar1 = p->nObjs;
  }
  iVar1 = 0;
  for (iVar5 = 0; iVar5 < p->vCos->nSize; iVar5 = iVar5 + 1) {
    pObj = Gia_ManCo(p,iVar5);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFaninId0p(p,pObj);
    iVar2 = __ptr[iVar2];
    if (iVar1 <= iVar2) {
      iVar1 = iVar2;
    }
    iVar3 = Gia_ObjId(p,pObj);
    __ptr[iVar3] = iVar2;
  }
  if (ppLevels == (int **)0x0) {
    free(__ptr);
  }
  else {
    *ppLevels = __ptr;
  }
  return iVar1;
}

Assistant:

int Gia_ManLutLevel( Gia_Man_t * p, int ** ppLevels )
{
    Gia_Obj_t * pObj;
    int i, k, iFan, Level;
    int * pLevels = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, i )
    {
        Level = 0;
        Gia_LutForEachFanin( p, i, iFan, k )
            if ( Level < pLevels[iFan] )
                Level = pLevels[iFan];
        pLevels[i] = Level + 1;
    }
    Level = 0;
    Gia_ManForEachCo( p, pObj, k )
    {
        int LevelFan = pLevels[Gia_ObjFaninId0p(p, pObj)];
        Level = Abc_MaxInt( Level, LevelFan );
        pLevels[Gia_ObjId(p, pObj)] = LevelFan;
    }
    if ( ppLevels )
        *ppLevels = pLevels;
    else
        ABC_FREE( pLevels );
    return Level;
}